

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O3

void random_field_element_magnitude(secp256k1_fe *fe)

{
  uint64_t *puVar1;
  ushort uVar2;
  ushort uVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  uint64_t uVar90;
  uint64_t uVar91;
  uint64_t uVar92;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  int iVar97;
  uint32_t uVar98;
  int iVar99;
  uint uVar100;
  ulong uVar101;
  long lVar102;
  ulong uVar103;
  long lVar104;
  int extraout_EDX;
  long extraout_RDX;
  ulong uVar105;
  secp256k1_gej *psVar106;
  secp256k1_fe *a;
  ulong uVar107;
  secp256k1_fe *psVar108;
  secp256k1_gej *psVar109;
  secp256k1_fe *psVar110;
  secp256k1_fe *psVar111;
  secp256k1_fe *psVar112;
  secp256k1_fe *psVar113;
  secp256k1_ge *x;
  secp256k1_ge *r;
  secp256k1_gej *b;
  secp256k1_gej *__src;
  secp256k1_gej *psVar114;
  ulong uVar115;
  ulong uVar116;
  ulong unaff_R12;
  secp256k1_ge *psVar117;
  ulong unaff_R13;
  secp256k1_ge *r_00;
  int *piVar118;
  secp256k1_fe *a_00;
  secp256k1_fe *psVar119;
  bool bVar120;
  undefined1 auVar121 [16];
  secp256k1_fe zero;
  secp256k1_fe sStack_648;
  secp256k1_fe *psStack_618;
  secp256k1_fe sStack_608;
  secp256k1_fe sStack_5d8;
  secp256k1_fe sStack_5a8;
  secp256k1_fe sStack_570;
  secp256k1_fe sStack_540;
  secp256k1_fe sStack_510;
  secp256k1_gej *psStack_4d8;
  secp256k1_gej *psStack_4d0;
  secp256k1_fe *psStack_4c8;
  undefined1 *puStack_4c0;
  secp256k1_fe *psStack_4b8;
  secp256k1_fe *psStack_4b0;
  secp256k1_gej sStack_4a8;
  secp256k1_ge *psStack_408;
  int *piStack_400;
  secp256k1_gej *psStack_3f8;
  secp256k1_ge *psStack_3f0;
  code *pcStack_3e8;
  long lStack_3e0;
  undefined1 auStack_3d8 [88];
  undefined8 uStack_380;
  secp256k1_fe *psStack_378;
  secp256k1_fe *psStack_368;
  secp256k1_gej *psStack_360;
  ulong uStack_358;
  ulong uStack_350;
  secp256k1_fe sStack_348;
  secp256k1_fe sStack_318;
  secp256k1_fe *psStack_2e8;
  ulong uStack_2e0;
  ulong uStack_2d8;
  secp256k1_fe *psStack_2d0;
  secp256k1_fe *psStack_2c8;
  secp256k1_fe *psStack_2c0;
  secp256k1_fe sStack_2b8;
  secp256k1_fe sStack_288;
  uint64_t uStack_258;
  uint64_t uStack_250;
  uint64_t uStack_248;
  uint64_t uStack_240;
  secp256k1_gej *psStack_238;
  secp256k1_fe *psStack_230;
  secp256k1_fe *psStack_228;
  secp256k1_fe *psStack_218;
  undefined1 auStack_210 [24];
  ulong uStack_1f8;
  ulong uStack_1f0;
  undefined8 uStack_1e8;
  ushort auStack_1e0 [16];
  uint16_t auStack_1c0 [16];
  secp256k1_fe sStack_1a0;
  ushort auStack_160 [16];
  ushort auStack_140 [16];
  undefined1 auStack_120 [96];
  uint64_t uStack_c0;
  uint64_t uStack_b8;
  ulong uStack_b0;
  uint64_t uStack_a8;
  uint64_t uStack_a0;
  uint64_t uStack_98;
  uint64_t uStack_90;
  undefined8 uStack_88;
  secp256k1_fe *psStack_78;
  secp256k1_fe local_48;
  
  psVar110 = &local_48;
  psVar119 = &local_48;
  uVar98 = secp256k1_testrand_int(9);
  secp256k1_fe_normalize(fe);
  if (uVar98 == 0) {
    return;
  }
  local_48.magnitude = 0;
  local_48.normalized = 1;
  local_48.n[0] = 0;
  local_48.n[1] = 0;
  local_48.n[2] = 0;
  local_48.n[3] = 0;
  local_48.n[4] = 0;
  secp256k1_fe_verify(&local_48);
  secp256k1_fe_verify(&local_48);
  local_48.n[0] = 0x1ffffdfffff85e;
  local_48.n[1] = 0x1ffffffffffffe;
  local_48.n[2] = 0x1ffffffffffffe;
  local_48.n[3] = 0x1ffffffffffffe;
  local_48.n[4] = 0x1fffffffffffe;
  local_48.magnitude = 1;
  local_48.normalized = 0;
  secp256k1_fe_verify(&local_48);
  psVar108 = (secp256k1_fe *)(ulong)(uVar98 - 1);
  secp256k1_fe_mul_int_unchecked(&local_48,uVar98 - 1);
  secp256k1_fe_verify(fe);
  secp256k1_fe_verify(&local_48);
  iVar99 = local_48.magnitude + fe->magnitude;
  if (iVar99 < 0x21) {
    uVar90 = fe->n[1];
    uVar91 = fe->n[2];
    uVar92 = fe->n[3];
    fe->n[0] = fe->n[0] + local_48.n[0];
    fe->n[1] = uVar90 + local_48.n[1];
    fe->n[2] = uVar91 + local_48.n[2];
    fe->n[3] = uVar92 + local_48.n[3];
    fe->n[4] = fe->n[4] + local_48.n[4];
    fe->magnitude = iVar99;
    fe->normalized = 0;
    psVar110 = fe;
    secp256k1_fe_verify(fe);
    if (fe->magnitude == uVar98) {
      return;
    }
  }
  else {
    random_field_element_magnitude_cold_2();
  }
  random_field_element_magnitude_cold_1();
  psStack_78 = fe;
  auStack_210._0_8_ = psVar110->n[0];
  auStack_210._8_8_ = psVar110->n[1];
  unique0x00006c80 = *(undefined1 (*) [16])(psVar110->n + 2);
  uStack_1f0 = psVar110->n[4];
  uStack_1e8._0_4_ = psVar110->magnitude;
  uStack_1e8._4_4_ = psVar110->normalized;
  if (extraout_EDX == 0) {
    psStack_228 = (secp256k1_fe *)0x1573b8;
    secp256k1_fe_mul((secp256k1_fe *)auStack_210,(secp256k1_fe *)auStack_210,psVar108);
LAB_001573b8:
    uStack_b0 = psVar110->n[0];
    uStack_a8 = psVar110->n[1];
    uStack_a0 = psVar110->n[2];
    uStack_98 = psVar110->n[3];
    uStack_90 = psVar110->n[4];
    uStack_88._0_4_ = psVar110->magnitude;
    uStack_88._4_4_ = psVar110->normalized;
    psVar106 = (secp256k1_gej *)&uStack_b0;
    auStack_120._64_8_ = psVar108->n[0];
    auStack_120._72_8_ = psVar108->n[1];
    auStack_120._80_16_ = *(undefined1 (*) [16])(psVar108->n + 2);
    uStack_c0 = psVar108->n[4];
    uStack_b8._0_4_ = psVar108->magnitude;
    uStack_b8._4_4_ = psVar108->normalized;
    psVar108 = (secp256k1_fe *)(auStack_120 + 0x40);
    psVar119 = (secp256k1_fe *)auStack_210;
    psStack_228 = (secp256k1_fe *)0x157408;
    secp256k1_fe_normalize_var(psVar119);
    psStack_228 = (secp256k1_fe *)0x157410;
    secp256k1_fe_normalize_var((secp256k1_fe *)psVar106);
    psStack_228 = (secp256k1_fe *)0x157418;
    secp256k1_fe_normalize_var(psVar108);
    psStack_228 = (secp256k1_fe *)0x157428;
    secp256k1_fe_get_b32((uchar *)auStack_140,(secp256k1_fe *)psVar106);
    psStack_228 = (secp256k1_fe *)0x157438;
    secp256k1_fe_get_b32((uchar *)auStack_160,psVar108);
    psStack_228 = (secp256k1_fe *)0x157448;
    secp256k1_fe_get_b32((uchar *)(sStack_1a0.n + 4),psVar119);
    lVar102 = 0x10;
    lVar104 = 0;
    do {
      uVar2 = auStack_160[lVar102 + -1];
      *(ushort *)((long)sStack_1a0.n + lVar104) =
           auStack_140[lVar102 + -1] << 8 | auStack_140[lVar102 + -1] >> 8;
      uVar3 = *(ushort *)((long)sStack_1a0.n + lVar102 * 2 + 0x1e);
      *(ushort *)((long)auStack_1c0 + lVar104) = uVar2 << 8 | uVar2 >> 8;
      *(ushort *)((long)auStack_1e0 + lVar104) = uVar3 << 8 | uVar3 >> 8;
      lVar104 = lVar104 + 2;
      lVar102 = lVar102 + -1;
    } while (lVar102 != 0);
    psVar109 = (secp256k1_gej *)auStack_120;
    a = &sStack_1a0;
    psStack_228 = (secp256k1_fe *)0x1574af;
    mulmod256((uint16_t *)psVar109,(uint16_t *)a,auStack_1c0,test_fe_mul::m16);
    lVar102 = 0;
    while (auStack_120[lVar102] == *(char *)((long)auStack_1e0 + lVar102)) {
      lVar102 = lVar102 + 1;
      if (lVar102 == 0x20) {
        return;
      }
    }
  }
  else {
    psVar106 = (secp256k1_gej *)auStack_210;
    psStack_228 = (secp256k1_fe *)0x157142;
    a = psVar108;
    psVar109 = psVar106;
    secp256k1_fe_verify((secp256k1_fe *)psVar106);
    if ((int)uStack_1e8 < 9) {
      unaff_R12 = auStack_210._16_8_;
      unaff_R13 = uStack_1f8;
      auVar121._8_8_ = 0;
      auVar121._0_8_ = auStack_210._0_8_ * 2;
      auVar44._8_8_ = 0;
      auVar44._0_8_ = uStack_1f8;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = auStack_210._8_8_ * 2;
      auVar45._8_8_ = 0;
      auVar45._0_8_ = auStack_210._16_8_;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = uStack_1f0;
      auVar46._8_8_ = 0;
      auVar46._0_8_ = uStack_1f0;
      uVar101 = SUB168(auVar6 * auVar46,0);
      auVar7._8_8_ = 0;
      auVar7._0_8_ = uVar101 & 0xfffffffffffff;
      auVar121 = auVar5 * auVar45 + auVar121 * auVar44 + auVar7 * ZEXT816(0x1000003d10);
      uVar105 = auVar121._0_8_;
      auStack_120._0_8_ = uVar105 & 0xfffffffffffff;
      auVar76._8_8_ = 0;
      auVar76._0_8_ = uVar105 >> 0x34 | auVar121._8_8_ << 0xc;
      uVar105 = uStack_1f0 * 2;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = auStack_210._0_8_;
      auVar47._8_8_ = 0;
      auVar47._0_8_ = uVar105;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = auStack_210._8_8_ * 2;
      auVar48._8_8_ = 0;
      auVar48._0_8_ = uStack_1f8;
      auVar10._8_8_ = 0;
      auVar10._0_8_ = auStack_210._16_8_;
      auVar49._8_8_ = 0;
      auVar49._0_8_ = auStack_210._16_8_;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = uVar101 >> 0x34 | SUB168(auVar6 * auVar46,8) << 0xc;
      auVar121 = auVar8 * auVar47 + auVar76 + auVar9 * auVar48 + auVar10 * auVar49 +
                 auVar11 * ZEXT816(0x1000003d10);
      uVar101 = auVar121._0_8_;
      auVar77._8_8_ = 0;
      auVar77._0_8_ = uVar101 >> 0x34 | auVar121._8_8_ << 0xc;
      auStack_120._64_8_ = (uVar101 & 0xfffffffffffff) >> 0x30;
      uStack_b0 = uVar101 & 0xffffffffffff;
      auVar12._8_8_ = 0;
      auVar12._0_8_ = auStack_210._0_8_;
      auVar50._8_8_ = 0;
      auVar50._0_8_ = auStack_210._0_8_;
      auVar13._8_8_ = 0;
      auVar13._0_8_ = auStack_210._8_8_;
      auVar51._8_8_ = 0;
      auVar51._0_8_ = uVar105;
      auVar14._8_8_ = 0;
      auVar14._0_8_ = auStack_210._16_8_ * 2;
      auVar52._8_8_ = 0;
      auVar52._0_8_ = uStack_1f8;
      auVar121 = auVar13 * auVar51 + auVar77 + auVar14 * auVar52;
      uVar101 = auVar121._0_8_;
      auVar79._8_8_ = 0;
      auVar79._0_8_ = uVar101 >> 0x34 | auVar121._8_8_ << 0xc;
      auVar53._8_8_ = 0;
      auVar53._0_8_ = (uVar101 & 0xfffffffffffff) << 4 | auStack_120._64_8_;
      auVar121 = auVar12 * auVar50 + ZEXT816(0x1000003d1) * auVar53;
      uVar115 = auVar121._0_8_;
      auVar78._8_8_ = 0;
      auVar78._0_8_ = uVar115 >> 0x34 | auVar121._8_8_ << 0xc;
      auVar15._8_8_ = 0;
      auVar15._0_8_ = auStack_210._0_8_ * 2;
      auVar54._8_8_ = 0;
      auVar54._0_8_ = auStack_210._8_8_;
      auVar16._8_8_ = 0;
      auVar16._0_8_ = auStack_210._16_8_;
      auVar55._8_8_ = 0;
      auVar55._0_8_ = uVar105;
      auVar17._8_8_ = 0;
      auVar17._0_8_ = uStack_1f8;
      auVar56._8_8_ = 0;
      auVar56._0_8_ = uStack_1f8;
      auVar5 = auVar16 * auVar55 + auVar79 + auVar17 * auVar56;
      uVar101 = auVar5._0_8_;
      auVar18._8_8_ = 0;
      auVar18._0_8_ = uVar101 & 0xfffffffffffff;
      auVar121 = auVar15 * auVar54 + auVar78 + auVar18 * ZEXT816(0x1000003d10);
      uVar116 = auVar121._0_8_;
      auVar81._8_8_ = 0;
      auVar81._0_8_ = uVar101 >> 0x34 | auVar5._8_8_ << 0xc;
      auVar80._8_8_ = 0;
      auVar80._0_8_ = uVar116 >> 0x34 | auVar121._8_8_ << 0xc;
      auVar19._8_8_ = 0;
      auVar19._0_8_ = auStack_210._0_8_ * 2;
      auVar57._8_8_ = 0;
      auVar57._0_8_ = auStack_210._16_8_;
      auVar20._8_8_ = 0;
      auVar20._0_8_ = auStack_210._8_8_;
      auVar58._8_8_ = 0;
      auVar58._0_8_ = auStack_210._8_8_;
      auVar21._8_8_ = 0;
      auVar21._0_8_ = uStack_1f8;
      auVar59._8_8_ = 0;
      auVar59._0_8_ = uVar105;
      auVar81 = auVar21 * auVar59 + auVar81;
      uVar105 = auVar81._0_8_;
      auVar22._8_8_ = 0;
      auVar22._0_8_ = uVar105 & 0xfffffffffffff;
      auVar121 = auVar19 * auVar57 + auVar80 + auVar20 * auVar58 + auVar22 * ZEXT816(0x1000003d10);
      uVar101 = auVar121._0_8_;
      auVar82._8_8_ = 0;
      auVar82._0_8_ = (uVar101 >> 0x34 | auVar121._8_8_ << 0xc) + auStack_120._0_8_;
      auVar23._8_8_ = 0;
      auVar23._0_8_ = uVar105 >> 0x34 | auVar81._8_8_ << 0xc;
      auVar82 = auVar23 * ZEXT816(0x1000003d10) + auVar82;
      uVar105 = auVar82._0_8_;
      uStack_1f8 = uVar105 & 0xfffffffffffff;
      auStack_210._16_8_ = uVar101 & 0xfffffffffffff;
      uStack_1f0 = (uVar105 >> 0x34 | auVar82._8_8_ << 0xc) + uStack_b0;
      uStack_1e8._0_4_ = 1;
      uStack_1e8._4_4_ = 0;
      psStack_228 = (secp256k1_fe *)0x1573a6;
      psStack_218 = psVar108;
      auStack_210._0_8_ = uVar115 & 0xfffffffffffff;
      auStack_210._8_8_ = uVar116 & 0xfffffffffffff;
      secp256k1_fe_verify((secp256k1_fe *)auStack_210);
      goto LAB_001573b8;
    }
    psStack_228 = (secp256k1_fe *)0x1574de;
    test_fe_mul_cold_1();
  }
  psStack_228 = (secp256k1_fe *)test_sqrt;
  test_fe_mul_cold_2();
  psVar111 = &sStack_2b8;
  psVar112 = &sStack_2b8;
  psVar113 = &sStack_2b8;
  a_00 = &sStack_2b8;
  psStack_2c0 = (secp256k1_fe *)0x1574fd;
  psStack_238 = psVar106;
  psStack_230 = psVar108;
  psStack_228 = psVar119;
  uVar100 = secp256k1_fe_sqrt(&sStack_2b8,&psVar109->x);
  if (uVar100 == (a == (secp256k1_fe *)0x0)) {
    psStack_2c0 = (secp256k1_fe *)0x1576c1;
    test_sqrt_cold_7();
LAB_001576c1:
    a_00 = psVar108;
    psStack_2c0 = (secp256k1_fe *)0x1576c6;
    test_sqrt_cold_6();
LAB_001576c6:
    psStack_2c0 = (secp256k1_fe *)0x1576cb;
    test_sqrt_cold_5();
LAB_001576cb:
    psVar113 = psVar111;
    psStack_2c0 = (secp256k1_fe *)0x1576d0;
    test_sqrt_cold_4();
LAB_001576d0:
    psStack_2c0 = (secp256k1_fe *)0x1576d5;
    test_sqrt_cold_3();
LAB_001576d5:
    psStack_2c0 = (secp256k1_fe *)0x1576da;
    test_sqrt_cold_2();
  }
  else {
    if (a == (secp256k1_fe *)0x0) {
      return;
    }
    psStack_2c0 = (secp256k1_fe *)0x157521;
    secp256k1_fe_verify(&sStack_2b8);
    psVar111 = psVar112;
    psVar108 = &sStack_2b8;
    if (1 < sStack_2b8.magnitude) goto LAB_001576c1;
    sStack_288.n[0] = 0x3ffffbfffff0bc - sStack_2b8.n[0];
    sStack_288.n[1] = 0x3ffffffffffffc - sStack_2b8.n[1];
    sStack_288.n[2] = 0x3ffffffffffffc - sStack_2b8.n[2];
    sStack_288.n[3] = 0x3ffffffffffffc - sStack_2b8.n[3];
    psVar119 = (secp256k1_fe *)(0x3fffffffffffc - sStack_2b8.n[4]);
    sStack_288.magnitude = 2;
    sStack_288.normalized = 0;
    psStack_2c0 = (secp256k1_fe *)0x157583;
    sStack_288.n[4] = (uint64_t)psVar119;
    uStack_258 = sStack_288.n[2];
    uStack_250 = sStack_288.n[3];
    uStack_248 = sStack_288.n[0];
    uStack_240 = sStack_288.n[1];
    secp256k1_fe_verify(&sStack_288);
    psStack_2c0 = (secp256k1_fe *)0x15758b;
    secp256k1_fe_verify(&sStack_2b8);
    psStack_2c0 = (secp256k1_fe *)0x157593;
    psVar111 = a;
    secp256k1_fe_verify(a);
    iVar99 = a->magnitude + sStack_2b8.magnitude;
    if (0x20 < iVar99) goto LAB_001576c6;
    sStack_2b8.n[0] = a->n[0] + sStack_2b8.n[0];
    sStack_2b8.n[1] = a->n[1] + sStack_2b8.n[1];
    sStack_2b8.n[2] = a->n[2] + sStack_2b8.n[2];
    sStack_2b8.n[3] = a->n[3] + sStack_2b8.n[3];
    sStack_2b8.n[4] = sStack_2b8.n[4] + a->n[4];
    sStack_2b8.normalized = 0;
    psStack_2c0 = (secp256k1_fe *)0x1575d8;
    sStack_2b8.magnitude = iVar99;
    secp256k1_fe_verify(&sStack_2b8);
    psStack_2c0 = (secp256k1_fe *)0x1575e2;
    secp256k1_fe_verify(&sStack_288);
    psStack_2c0 = (secp256k1_fe *)0x1575ea;
    psVar111 = a;
    secp256k1_fe_verify(a);
    a_00 = &sStack_2b8;
    if (0x1e < a->magnitude) goto LAB_001576cb;
    a_00 = &sStack_288;
    sStack_288.n[0] = a->n[0] + uStack_248;
    sStack_288.n[1] = a->n[1] + uStack_240;
    sStack_288.n[2] = a->n[2] + uStack_258;
    sStack_288.n[3] = a->n[3] + uStack_250;
    psVar119 = (secp256k1_fe *)((long)psVar119->n + a->n[4]);
    sStack_288.normalized = 0;
    sStack_288.magnitude = a->magnitude + 2;
    psStack_2c0 = (secp256k1_fe *)0x15763a;
    sStack_288.n[4] = (uint64_t)psVar119;
    secp256k1_fe_verify(a_00);
    psStack_2c0 = (secp256k1_fe *)0x157645;
    secp256k1_fe_normalize(&sStack_2b8);
    psStack_2c0 = (secp256k1_fe *)0x15764d;
    secp256k1_fe_normalize(a_00);
    psStack_2c0 = (secp256k1_fe *)0x157655;
    secp256k1_fe_verify(&sStack_2b8);
    a = &sStack_2b8;
    if (sStack_2b8.normalized == 0) goto LAB_001576d0;
    auVar93._8_8_ = sStack_2b8.n[1];
    auVar93._0_8_ = sStack_2b8.n[0];
    auVar94._8_8_ = sStack_2b8.n[3];
    auVar94._0_8_ = sStack_2b8.n[2];
    if ((SUB168(auVar93 | auVar94,8) == 0 && SUB168(auVar93 | auVar94,0) == 0) &&
        sStack_2b8.n[4] == 0) {
      return;
    }
    a = &sStack_288;
    psStack_2c0 = (secp256k1_fe *)0x157688;
    psVar113 = a;
    secp256k1_fe_verify(a);
    if (sStack_288.normalized == 0) goto LAB_001576d5;
    auVar95._8_8_ = sStack_288.n[1];
    auVar95._0_8_ = sStack_288.n[0];
    auVar96._8_8_ = sStack_288.n[3];
    auVar96._0_8_ = sStack_288.n[2];
    if ((SUB168(auVar95 | auVar96,8) == 0 && SUB168(auVar95 | auVar96,0) == 0) &&
        (secp256k1_fe *)sStack_288.n[4] == (secp256k1_fe *)0x0) {
      return;
    }
  }
  psStack_2c0 = (secp256k1_fe *)random_group_element_jacobian_test;
  test_sqrt_cold_1();
  psVar117 = (secp256k1_ge *)(psVar113 + 2);
  psStack_378 = (secp256k1_fe *)0x157702;
  psVar106 = psVar109;
  psStack_2e8 = a;
  uStack_2e0 = unaff_R12;
  uStack_2d8 = unaff_R13;
  psStack_2d0 = a_00;
  psStack_2c8 = psVar119;
  psStack_2c0 = psVar110;
  random_fe_non_zero_test((secp256k1_fe *)psVar117);
  psStack_378 = (secp256k1_fe *)0x15770a;
  x = psVar117;
  secp256k1_fe_verify((secp256k1_fe *)psVar117);
  if (psVar113[2].magnitude < 9) {
    psStack_368 = psVar113;
    psStack_360 = psVar109;
    uVar105 = (psVar117->x).n[0];
    uVar101 = psVar113[2].n[1];
    uVar115 = psVar113[2].n[2];
    uVar116 = psVar113[2].n[3];
    uVar4 = psVar113[2].n[4];
    auVar24._8_8_ = 0;
    auVar24._0_8_ = uVar105 * 2;
    auVar60._8_8_ = 0;
    auVar60._0_8_ = uVar116;
    auVar25._8_8_ = 0;
    auVar25._0_8_ = uVar101 * 2;
    auVar61._8_8_ = 0;
    auVar61._0_8_ = uVar115;
    auVar26._8_8_ = 0;
    auVar26._0_8_ = uVar4;
    auVar62._8_8_ = 0;
    auVar62._0_8_ = uVar4;
    uVar103 = SUB168(auVar26 * auVar62,0);
    auVar27._8_8_ = 0;
    auVar27._0_8_ = uVar103 & 0xfffffffffffff;
    auVar121 = auVar25 * auVar61 + auVar24 * auVar60 + auVar27 * ZEXT816(0x1000003d10);
    uVar107 = auVar121._0_8_;
    sStack_348.n[0] = uVar107 & 0xfffffffffffff;
    auVar83._8_8_ = 0;
    auVar83._0_8_ = uVar107 >> 0x34 | auVar121._8_8_ << 0xc;
    uVar4 = uVar4 * 2;
    auVar28._8_8_ = 0;
    auVar28._0_8_ = uVar105;
    auVar63._8_8_ = 0;
    auVar63._0_8_ = uVar4;
    auVar29._8_8_ = 0;
    auVar29._0_8_ = uVar101 * 2;
    auVar64._8_8_ = 0;
    auVar64._0_8_ = uVar116;
    auVar30._8_8_ = 0;
    auVar30._0_8_ = uVar115;
    auVar65._8_8_ = 0;
    auVar65._0_8_ = uVar115;
    auVar31._8_8_ = 0;
    auVar31._0_8_ = uVar103 >> 0x34 | SUB168(auVar26 * auVar62,8) << 0xc;
    auVar121 = auVar28 * auVar63 + auVar83 + auVar29 * auVar64 + auVar30 * auVar65 +
               auVar31 * ZEXT816(0x1000003d10);
    uStack_350 = auVar121._0_8_;
    auVar84._8_8_ = 0;
    auVar84._0_8_ = uStack_350 >> 0x34 | auVar121._8_8_ << 0xc;
    uStack_358 = (uStack_350 & 0xfffffffffffff) >> 0x30;
    uStack_350 = uStack_350 & 0xffffffffffff;
    auVar32._8_8_ = 0;
    auVar32._0_8_ = uVar105;
    auVar66._8_8_ = 0;
    auVar66._0_8_ = uVar105;
    auVar33._8_8_ = 0;
    auVar33._0_8_ = uVar101;
    auVar67._8_8_ = 0;
    auVar67._0_8_ = uVar4;
    auVar34._8_8_ = 0;
    auVar34._0_8_ = uVar115 * 2;
    auVar68._8_8_ = 0;
    auVar68._0_8_ = uVar116;
    auVar121 = auVar33 * auVar67 + auVar84 + auVar34 * auVar68;
    uVar103 = auVar121._0_8_;
    auVar86._8_8_ = 0;
    auVar86._0_8_ = uVar103 >> 0x34 | auVar121._8_8_ << 0xc;
    auVar69._8_8_ = 0;
    auVar69._0_8_ = (uVar103 & 0xfffffffffffff) << 4 | uStack_358;
    auVar121 = auVar32 * auVar66 + ZEXT816(0x1000003d1) * auVar69;
    uVar103 = auVar121._0_8_;
    sStack_318.n[0] = uVar103 & 0xfffffffffffff;
    auVar85._8_8_ = 0;
    auVar85._0_8_ = uVar103 >> 0x34 | auVar121._8_8_ << 0xc;
    auVar35._8_8_ = 0;
    auVar35._0_8_ = uVar105 * 2;
    auVar70._8_8_ = 0;
    auVar70._0_8_ = uVar101;
    auVar36._8_8_ = 0;
    auVar36._0_8_ = uVar115;
    auVar71._8_8_ = 0;
    auVar71._0_8_ = uVar4;
    auVar37._8_8_ = 0;
    auVar37._0_8_ = uVar116;
    auVar72._8_8_ = 0;
    auVar72._0_8_ = uVar116;
    auVar5 = auVar36 * auVar71 + auVar86 + auVar37 * auVar72;
    uVar103 = auVar5._0_8_;
    auVar38._8_8_ = 0;
    auVar38._0_8_ = uVar103 & 0xfffffffffffff;
    auVar121 = auVar35 * auVar70 + auVar85 + auVar38 * ZEXT816(0x1000003d10);
    uVar107 = auVar121._0_8_;
    auVar88._8_8_ = 0;
    auVar88._0_8_ = uVar103 >> 0x34 | auVar5._8_8_ << 0xc;
    sStack_318.n[1] = uVar107 & 0xfffffffffffff;
    auVar87._8_8_ = 0;
    auVar87._0_8_ = uVar107 >> 0x34 | auVar121._8_8_ << 0xc;
    auVar39._8_8_ = 0;
    auVar39._0_8_ = uVar105 * 2;
    auVar73._8_8_ = 0;
    auVar73._0_8_ = uVar115;
    auVar40._8_8_ = 0;
    auVar40._0_8_ = uVar101;
    auVar74._8_8_ = 0;
    auVar74._0_8_ = uVar101;
    auVar41._8_8_ = 0;
    auVar41._0_8_ = uVar116;
    auVar75._8_8_ = 0;
    auVar75._0_8_ = uVar4;
    auVar88 = auVar41 * auVar75 + auVar88;
    uVar105 = auVar88._0_8_;
    auVar42._8_8_ = 0;
    auVar42._0_8_ = uVar105 & 0xfffffffffffff;
    auVar121 = auVar39 * auVar73 + auVar87 + auVar40 * auVar74 + auVar42 * ZEXT816(0x1000003d10);
    uVar101 = auVar121._0_8_;
    sStack_318.n[2] = uVar101 & 0xfffffffffffff;
    auVar89._8_8_ = 0;
    auVar89._0_8_ = (uVar101 >> 0x34 | auVar121._8_8_ << 0xc) + sStack_348.n[0];
    auVar43._8_8_ = 0;
    auVar43._0_8_ = uVar105 >> 0x34 | auVar88._8_8_ << 0xc;
    auVar89 = auVar43 * ZEXT816(0x1000003d10) + auVar89;
    uVar105 = auVar89._0_8_;
    sStack_318.n[3] = uVar105 & 0xfffffffffffff;
    sStack_318.n[4] = (uVar105 >> 0x34 | auVar89._8_8_ << 0xc) + uStack_350;
    sStack_318.magnitude = 1;
    sStack_318.normalized = 0;
    psStack_378 = (secp256k1_fe *)0x15795e;
    secp256k1_fe_verify(&sStack_318);
    psStack_378 = (secp256k1_fe *)0x157971;
    secp256k1_fe_mul(&sStack_348,&sStack_318,(secp256k1_fe *)psVar117);
    psVar106 = psStack_360;
    psVar119 = psStack_368;
    psStack_378 = (secp256k1_fe *)0x157989;
    secp256k1_fe_mul(psStack_368,&psStack_360->x,&sStack_318);
    psStack_378 = (secp256k1_fe *)0x157999;
    secp256k1_fe_mul(psVar119 + 1,&psVar106->y,&sStack_348);
    *(int *)psVar119[3].n = (int)(psVar106->z).n[0];
    return;
  }
  psStack_378 = (secp256k1_fe *)random_fe_non_zero_test;
  random_group_element_jacobian_test_cold_1();
  psStack_378 = psVar113;
  while( true ) {
    uStack_380._0_4_ = 0x1579c7;
    uStack_380._4_4_ = 0;
    random_fe_test(&x->x);
    uStack_380._0_4_ = 0x1579cf;
    uStack_380._4_4_ = 0;
    r = x;
    secp256k1_fe_verify(&x->x);
    if ((x->x).normalized == 0) break;
    auVar121 = *(undefined1 (*) [16])((x->x).n + 2) | *(undefined1 (*) [16])(x->x).n;
    if ((auVar121._8_8_ != 0 || auVar121._0_8_ != 0) || (x->x).n[4] != 0) {
      return;
    }
  }
  uStack_380 = secp256k1_ge_set_all_gej_var;
  random_fe_non_zero_test_cold_1();
  if (extraout_RDX == 0) {
    return;
  }
  psVar110 = &psVar106->z;
  lStack_3e0 = -1;
  lVar102 = 0;
  r_00 = r;
  auStack_3d8._48_8_ = x;
  auStack_3d8._56_8_ = unaff_R12;
  auStack_3d8._64_8_ = unaff_R13;
  auStack_3d8._72_8_ = psVar109;
  auStack_3d8._80_8_ = psVar119;
  uStack_380 = (code *)psVar117;
  do {
    pcStack_3e8 = (code *)0x157a38;
    secp256k1_gej_verify((secp256k1_gej *)(psVar110 + -2));
    if ((int)psVar110[1].n[0] == 0) {
      if (lStack_3e0 == -1) {
        uVar90 = psVar110->n[0];
        uVar91 = psVar110->n[1];
        auVar121 = *(undefined1 (*) [16])(psVar110->n + 2);
        iVar99 = psVar110->magnitude;
        iVar97 = psVar110->normalized;
        (r_00->x).n[4] = psVar110->n[4];
        (r_00->x).magnitude = iVar99;
        (r_00->x).normalized = iVar97;
        *(undefined1 (*) [16])((r_00->x).n + 2) = auVar121;
        (r_00->x).n[0] = uVar90;
        (r_00->x).n[1] = uVar91;
        lStack_3e0 = lVar102;
      }
      else {
        pcStack_3e8 = (code *)0x157a66;
        secp256k1_fe_mul(&r_00->x,&r[lStack_3e0].x,psVar110);
        lStack_3e0 = lVar102;
      }
    }
    else {
      pcStack_3e8 = (code *)0x157a48;
      secp256k1_ge_set_infinity(r_00);
    }
    lVar104 = lStack_3e0;
    lVar102 = lVar102 + 1;
    r_00 = r_00 + 1;
    psVar110 = (secp256k1_fe *)(psVar110[3].n + 1);
  } while (extraout_RDX != lVar102);
  if (lStack_3e0 == -1) {
    return;
  }
  psVar117 = (secp256k1_ge *)(lStack_3e0 * 0x68);
  psVar109 = (secp256k1_gej *)(r + lStack_3e0);
  b = (secp256k1_gej *)auStack_3d8;
  pcStack_3e8 = (code *)0x157abf;
  secp256k1_fe_inv_var((secp256k1_fe *)b,(secp256k1_fe *)psVar109);
  if (lVar104 == 0) {
    lStack_3e0 = 0;
    piVar118 = (int *)0x0;
  }
  else {
    lVar102 = lVar104 + -1;
    piVar118 = &psVar106[lVar104 + -1].infinity;
    psVar117 = r + -1 + lVar104;
    do {
      if (*piVar118 == 0) {
        pcStack_3e8 = (code *)0x157b01;
        secp256k1_fe_mul(&r[lStack_3e0].x,&psVar117->x,(secp256k1_fe *)auStack_3d8);
        psVar109 = (secp256k1_gej *)auStack_3d8;
        pcStack_3e8 = (code *)0x157b1e;
        b = psVar109;
        secp256k1_fe_mul((secp256k1_fe *)psVar109,(secp256k1_fe *)psVar109,&psVar106[lStack_3e0].z);
        lStack_3e0 = lVar102;
      }
      piVar118 = piVar118 + -0x26;
      psVar117 = psVar117 + -1;
      bVar120 = lVar102 != 0;
      lVar102 = lVar102 + -1;
    } while (bVar120);
  }
  if (psVar106[lStack_3e0].infinity == 0) {
    puVar1 = r[lStack_3e0].x.n + 4;
    *puVar1 = auStack_3d8._32_8_;
    puVar1[1] = auStack_3d8._40_8_;
    puVar1 = r[lStack_3e0].x.n + 2;
    *puVar1 = auStack_3d8._16_8_;
    puVar1[1] = auStack_3d8._24_8_;
    r[lStack_3e0].x.n[0] = auStack_3d8._0_8_;
    r[lStack_3e0].x.n[1] = auStack_3d8._8_8_;
    for (lVar102 = extraout_RDX; lVar102 != 0; lVar102 = lVar102 + -1) {
      if (psVar106->infinity == 0) {
        pcStack_3e8 = (code *)0x157b94;
        secp256k1_ge_set_gej_zinv(r,psVar106,&r->x);
      }
      pcStack_3e8 = (code *)0x157b9c;
      secp256k1_ge_verify(r);
      r = r + 1;
      psVar106 = psVar106 + 1;
    }
    return;
  }
  pcStack_3e8 = test_gej_cmov;
  secp256k1_ge_set_all_gej_var_cold_1();
  __src = &sStack_4a8;
  psVar114 = &sStack_4a8;
  psStack_4b0 = (secp256k1_fe *)0x157bea;
  psStack_408 = psVar117;
  piStack_400 = piVar118;
  psStack_3f8 = psVar106;
  psStack_3f0 = r;
  pcStack_3e8 = (code *)lVar102;
  memcpy(&sStack_4a8,b,0x98);
  psStack_4b0 = (secp256k1_fe *)0x157bf2;
  secp256k1_gej_verify(&sStack_4a8);
  psStack_4b0 = (secp256k1_fe *)0x157bfa;
  secp256k1_gej_verify(psVar109);
  psStack_4b0 = (secp256k1_fe *)0x157c07;
  secp256k1_fe_cmov(&sStack_4a8.x,&psVar109->x,0);
  psVar119 = &psVar109->y;
  psStack_4b0 = (secp256k1_fe *)0x157c1a;
  secp256k1_fe_cmov(&sStack_4a8.y,psVar119,0);
  psVar108 = &sStack_4a8.z;
  psVar110 = &psVar109->z;
  psStack_4b0 = (secp256k1_fe *)0x157c30;
  secp256k1_fe_cmov(psVar108,psVar110,0);
  psStack_4b0 = (secp256k1_fe *)0x157c38;
  secp256k1_gej_verify(&sStack_4a8);
  psStack_4b0 = (secp256k1_fe *)0x157c43;
  psVar106 = b;
  iVar99 = gej_xyz_equals_gej(&sStack_4a8,b);
  if (iVar99 == 0) {
    psStack_4b0 = (secp256k1_fe *)0x157cda;
    test_gej_cmov_cold_2();
  }
  else {
    psStack_4b0 = (secp256k1_fe *)0x157c56;
    secp256k1_gej_verify(&sStack_4a8);
    psStack_4b0 = (secp256k1_fe *)0x157c5e;
    secp256k1_gej_verify(psVar109);
    psStack_4b0 = (secp256k1_fe *)0x157c6e;
    secp256k1_fe_cmov(&sStack_4a8.x,&psVar109->x,1);
    psStack_4b0 = (secp256k1_fe *)0x157c80;
    secp256k1_fe_cmov(&sStack_4a8.y,psVar119,1);
    psStack_4b0 = (secp256k1_fe *)0x157c90;
    secp256k1_fe_cmov(psVar108,psVar110,1);
    sStack_4a8.infinity = sStack_4a8.infinity & 0xfffffffeU | psVar109->infinity & 1U;
    psStack_4b0 = (secp256k1_fe *)0x157cb4;
    secp256k1_gej_verify(&sStack_4a8);
    psStack_4b0 = (secp256k1_fe *)0x157cbf;
    psVar106 = psVar109;
    iVar99 = gej_xyz_equals_gej(&sStack_4a8,psVar109);
    __src = psVar114;
    if (iVar99 != 0) {
      return;
    }
  }
  psStack_4b0 = (secp256k1_fe *)gej_xyz_equals_gej;
  test_gej_cmov_cold_1();
  psStack_4b0 = psVar110;
  psStack_4b8 = psVar119;
  puStack_4c0 = (undefined1 *)&sStack_4a8;
  psStack_4c8 = psVar108;
  psStack_4d0 = b;
  psStack_4d8 = psVar109;
  if ((*(int *)((long)__src + 0x90) != psVar106->infinity) || (*(int *)((long)__src + 0x90) != 0)) {
    return;
  }
  psStack_618 = (secp256k1_fe *)0x157d2c;
  memcpy(&sStack_570,__src,0x98);
  psVar119 = &sStack_608;
  psStack_618 = (secp256k1_fe *)0x157d41;
  memcpy(psVar119,psVar106,0x98);
  psStack_618 = (secp256k1_fe *)0x157d49;
  secp256k1_fe_normalize(&sStack_570);
  psStack_618 = (secp256k1_fe *)0x157d59;
  secp256k1_fe_normalize(&sStack_540);
  psStack_618 = (secp256k1_fe *)0x157d69;
  secp256k1_fe_normalize(&sStack_510);
  psStack_618 = (secp256k1_fe *)0x157d71;
  secp256k1_fe_normalize(psVar119);
  psVar110 = &sStack_5d8;
  psStack_618 = (secp256k1_fe *)0x157d7e;
  secp256k1_fe_normalize(psVar110);
  psVar108 = &sStack_5a8;
  psStack_618 = (secp256k1_fe *)0x157d8b;
  secp256k1_fe_normalize(psVar108);
  psStack_618 = (secp256k1_fe *)0x157d93;
  secp256k1_fe_verify(&sStack_570);
  psStack_618 = (secp256k1_fe *)0x157d9b;
  secp256k1_fe_verify(psVar119);
  if (sStack_570.normalized == 0) {
    psStack_618 = (secp256k1_fe *)0x157ea0;
    gej_xyz_equals_gej_cold_6();
LAB_00157ea0:
    psVar110 = psVar119;
    psStack_618 = (secp256k1_fe *)0x157ea5;
    gej_xyz_equals_gej_cold_5();
LAB_00157ea5:
    psStack_618 = (secp256k1_fe *)0x157eaa;
    gej_xyz_equals_gej_cold_4();
LAB_00157eaa:
    psVar108 = psVar110;
    psStack_618 = (secp256k1_fe *)0x157eaf;
    gej_xyz_equals_gej_cold_3();
  }
  else {
    if (sStack_608.normalized == 0) goto LAB_00157ea0;
    uVar100 = 4;
    do {
      uVar105 = sStack_608.n[uVar100];
      uVar101 = sStack_570.n[uVar100];
      if ((uVar101 >= uVar105 && uVar101 != uVar105) || (uVar101 < uVar105)) break;
      bVar120 = uVar100 != 0;
      uVar100 = uVar100 - 1;
    } while (bVar120);
    psStack_618 = (secp256k1_fe *)0x157de5;
    secp256k1_fe_verify(&sStack_540);
    psStack_618 = (secp256k1_fe *)0x157ded;
    secp256k1_fe_verify(psVar110);
    if (sStack_540.normalized == 0) goto LAB_00157ea5;
    if (sStack_5d8.normalized == 0) goto LAB_00157eaa;
    uVar100 = 4;
    do {
      uVar105 = sStack_5d8.n[uVar100];
      uVar101 = sStack_540.n[uVar100];
      if ((uVar101 >= uVar105 && uVar101 != uVar105) || (uVar101 < uVar105)) break;
      bVar120 = uVar100 != 0;
      uVar100 = uVar100 - 1;
    } while (bVar120);
    psStack_618 = (secp256k1_fe *)0x157e3e;
    secp256k1_fe_verify(&sStack_510);
    psStack_618 = (secp256k1_fe *)0x157e46;
    secp256k1_fe_verify(psVar108);
    if (sStack_510.normalized != 0) {
      if (sStack_5a8.normalized != 0) {
        uVar100 = 4;
        do {
          if (sStack_510.n[uVar100] != sStack_5a8.n[uVar100]) {
            return;
          }
          bVar120 = uVar100 != 0;
          uVar100 = uVar100 - 1;
        } while (bVar120);
        return;
      }
      goto LAB_00157eb4;
    }
  }
  psStack_618 = (secp256k1_fe *)0x157eb4;
  gej_xyz_equals_gej_cold_2();
LAB_00157eb4:
  psStack_618 = (secp256k1_fe *)secp256k1_gej_has_quad_y_var;
  gej_xyz_equals_gej_cold_1();
  if ((int)psVar108[3].n[0] == 0) {
    psStack_618 = &sStack_510;
    secp256k1_fe_mul(&sStack_648,psVar108 + 1,psVar108 + 2);
    secp256k1_fe_is_square_var(&sStack_648);
    return;
  }
  return;
}

Assistant:

static void random_field_element_magnitude(secp256k1_fe *fe) {
    secp256k1_fe zero;
    int n = secp256k1_testrand_int(9);
    secp256k1_fe_normalize(fe);
    if (n == 0) {
        return;
    }
    secp256k1_fe_clear(&zero);
    secp256k1_fe_negate(&zero, &zero, 0);
    secp256k1_fe_mul_int_unchecked(&zero, n - 1);
    secp256k1_fe_add(fe, &zero);
#ifdef VERIFY
    CHECK(fe->magnitude == n);
#endif
}